

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_partial_sig_agg
              (secp256k1_context *ctx,uchar *sig64,secp256k1_musig_session *session,
              secp256k1_musig_partial_sig **partial_sigs,size_t n_sigs)

{
  secp256k1_scalar *r;
  int iVar1;
  size_t sVar2;
  secp256k1_scalar term;
  secp256k1_musig_session_internal session_i;
  secp256k1_scalar local_d8;
  secp256k1_musig_session_internal local_b8;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_musig_partial_sig_agg_cold_5();
  }
  else if (sig64 != (uchar *)0x0) {
    if (session == (secp256k1_musig_session *)0x0) {
      secp256k1_musig_partial_sig_agg_cold_3();
      return 0;
    }
    if (partial_sigs == (secp256k1_musig_partial_sig **)0x0) {
      secp256k1_musig_partial_sig_agg_cold_2();
      return 0;
    }
    if (n_sigs == 0) {
      secp256k1_musig_partial_sig_agg_cold_1();
      return 0;
    }
    iVar1 = secp256k1_musig_session_load(ctx,&local_b8,session);
    if (iVar1 == 0) {
      return 0;
    }
    r = &local_b8.s_part;
    sVar2 = 0;
    do {
      iVar1 = secp256k1_musig_partial_sig_load(ctx,&local_d8,partial_sigs[sVar2]);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_add(r,r,&local_d8);
      sVar2 = sVar2 + 1;
    } while (n_sigs != sVar2);
    secp256k1_scalar_get_b32(sig64 + 0x20,r);
    *(undefined8 *)(sig64 + 0x10) = local_b8.fin_nonce._16_8_;
    *(undefined8 *)(sig64 + 0x18) = local_b8.fin_nonce._24_8_;
    *(undefined8 *)sig64 = local_b8.fin_nonce._0_8_;
    *(undefined8 *)(sig64 + 8) = local_b8.fin_nonce._8_8_;
    return 1;
  }
  secp256k1_musig_partial_sig_agg_cold_4();
  return 0;
}

Assistant:

int secp256k1_musig_partial_sig_agg(const secp256k1_context* ctx, unsigned char *sig64, const secp256k1_musig_session *session, const secp256k1_musig_partial_sig * const* partial_sigs, size_t n_sigs) {
    size_t i;
    secp256k1_musig_session_internal session_i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(session != NULL);
    ARG_CHECK(partial_sigs != NULL);
    ARG_CHECK(n_sigs > 0);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        return 0;
    }
    for (i = 0; i < n_sigs; i++) {
        secp256k1_scalar term;
        if (!secp256k1_musig_partial_sig_load(ctx, &term, partial_sigs[i])) {
            return 0;
        }
        secp256k1_scalar_add(&session_i.s_part, &session_i.s_part, &term);
    }
    secp256k1_scalar_get_b32(&sig64[32], &session_i.s_part);
    memcpy(&sig64[0], session_i.fin_nonce, 32);
    return 1;
}